

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceFieldOptions.cpp
# Opt level: O0

void __thiscall OpenMD::ForceFieldOptions::ForceFieldOptions(ForceFieldOptions *this)

{
  undefined1 uVar1;
  undefined8 *in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>,_bool>
  pVar2;
  string *in_stack_ffffffffffffea48;
  undefined7 in_stack_ffffffffffffea50;
  undefined1 in_stack_ffffffffffffea57;
  value_type *in_stack_ffffffffffffea58;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  *in_stack_ffffffffffffea60;
  value_type *__x;
  undefined7 in_stack_ffffffffffffea70;
  allocator<char> *in_stack_ffffffffffffea80;
  allocator<char> *__a;
  char *in_stack_ffffffffffffea88;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffea90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined1 local_f91 [33];
  _Base_ptr local_f70;
  undefined1 local_f68;
  undefined8 *local_f60;
  allocator<char> local_f51;
  string local_f50 [78];
  bool local_f02;
  allocator<char> local_f01;
  string local_f00 [32];
  _Base_ptr local_ee0;
  undefined1 local_ed8;
  undefined8 *local_ed0;
  allocator<char> local_ec1;
  string local_ec0 [79];
  allocator<char> local_e71;
  string local_e70 [39];
  allocator<char> local_e49;
  string local_e48 [32];
  _Base_ptr local_e28;
  undefined1 local_e20;
  undefined8 *local_e18;
  allocator<char> local_e09;
  string local_e08 [72];
  double local_dc0;
  allocator<char> local_db1;
  string local_db0 [32];
  _Base_ptr local_d90;
  undefined1 local_d88;
  undefined8 *local_d80;
  allocator<char> local_d71;
  string local_d70 [72];
  double local_d28;
  allocator<char> local_d19;
  string local_d18 [32];
  _Base_ptr local_cf8;
  undefined1 local_cf0;
  undefined8 *local_ce8;
  allocator<char> local_cd9;
  string local_cd8 [72];
  double local_c90;
  allocator<char> local_c81;
  string local_c80 [32];
  _Base_ptr local_c60;
  undefined1 local_c58;
  undefined8 *local_c50;
  allocator<char> local_c41;
  string local_c40 [72];
  double local_bf8;
  allocator<char> local_be9;
  string local_be8 [32];
  _Base_ptr local_bc8;
  undefined1 local_bc0;
  undefined8 *local_bb8;
  allocator<char> local_ba9;
  string local_ba8 [79];
  allocator<char> local_b59;
  string local_b58 [32];
  _Base_ptr local_b38;
  undefined1 local_b30;
  undefined8 *local_b28;
  allocator<char> local_b19;
  string local_b18 [79];
  allocator<char> local_ac9;
  string local_ac8 [32];
  _Base_ptr local_aa8;
  undefined1 local_aa0;
  undefined8 *local_a98;
  allocator<char> local_a89;
  string local_a88 [79];
  allocator<char> local_a39;
  string local_a38 [32];
  _Base_ptr local_a18;
  undefined1 local_a10;
  undefined8 *local_a08;
  allocator<char> local_9f9;
  string local_9f8 [79];
  allocator<char> local_9a9;
  string local_9a8 [32];
  _Base_ptr local_988;
  undefined1 local_980;
  undefined8 *local_978;
  allocator<char> local_969;
  string local_968 [79];
  allocator<char> local_919;
  string local_918 [32];
  _Base_ptr local_8f8;
  undefined1 local_8f0;
  undefined8 *local_8e8;
  allocator<char> local_8d9;
  string local_8d8 [79];
  allocator<char> local_889;
  string local_888 [32];
  _Base_ptr local_868;
  undefined1 local_860;
  undefined8 *local_858;
  allocator<char> local_849;
  string local_848 [79];
  allocator<char> local_7f9;
  string local_7f8 [39];
  allocator<char> local_7d1;
  string local_7d0 [32];
  _Base_ptr local_7b0;
  undefined1 local_7a8;
  undefined8 *local_7a0;
  allocator<char> local_791;
  string local_790 [72];
  double local_748;
  allocator<char> local_739;
  string local_738 [32];
  _Base_ptr local_718;
  undefined1 local_710;
  undefined8 *local_708;
  allocator<char> local_6f9;
  string local_6f8 [72];
  double local_6b0;
  allocator<char> local_6a1;
  string local_6a0 [32];
  _Base_ptr local_680;
  undefined1 local_678;
  undefined8 *local_670;
  allocator<char> local_661;
  string local_660 [72];
  double local_618;
  allocator<char> local_609;
  string local_608 [32];
  _Base_ptr local_5e8;
  undefined1 local_5e0;
  undefined8 *local_5d8;
  allocator<char> local_5c9;
  string local_5c8 [72];
  double local_580;
  allocator<char> local_571;
  string local_570 [32];
  _Base_ptr local_550;
  undefined1 local_548;
  undefined8 *local_540;
  allocator<char> local_531;
  string local_530 [72];
  double local_4e8;
  allocator<char> local_4d9;
  string local_4d8 [32];
  _Base_ptr local_4b8;
  undefined1 local_4b0;
  undefined8 *local_4a8;
  allocator<char> local_499;
  string local_498 [72];
  double local_450;
  allocator<char> local_441;
  string local_440 [32];
  _Base_ptr local_420;
  undefined1 local_418;
  undefined8 *local_410;
  allocator<char> local_401;
  string local_400 [72];
  double local_3b8;
  allocator<char> local_3a9;
  string local_3a8 [32];
  _Base_ptr local_388;
  undefined1 local_380;
  undefined8 *local_378;
  allocator<char> local_369;
  string local_368 [79];
  allocator<char> local_319;
  string local_318 [39];
  allocator<char> local_2f1;
  string local_2f0 [32];
  _Base_ptr local_2d0;
  undefined1 local_2c8;
  undefined8 *local_2c0;
  allocator<char> local_2b1;
  string local_2b0 [79];
  allocator<char> local_261;
  string local_260 [39];
  allocator<char> local_239;
  string local_238 [32];
  _Base_ptr local_218;
  undefined1 local_210;
  undefined8 *local_208;
  allocator<char> local_1f9;
  string local_1f8 [79];
  allocator<char> local_1a9;
  string local_1a8 [39];
  allocator<char> local_181;
  string local_180 [32];
  _Base_ptr local_160;
  undefined1 local_158;
  undefined8 *local_150;
  allocator<char> local_141;
  string local_140 [79];
  allocator<char> local_f1;
  string local_f0 [39];
  allocator<char> local_c9;
  string local_c8 [32];
  _Base_ptr local_a8;
  undefined1 local_a0;
  undefined8 *local_98;
  allocator<char> local_89;
  string local_88 [79];
  allocator<char> local_39;
  string local_38 [56];
  
  DataHolder::DataHolder
            ((DataHolder *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
  *in_RDI = &PTR__ForceFieldOptions_00505f58;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
  Parameter<double>::Parameter
            ((Parameter<double> *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
  Parameter<double>::Parameter
            ((Parameter<double> *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
  Parameter<double>::Parameter
            ((Parameter<double> *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
  Parameter<double>::Parameter
            ((Parameter<double> *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
  Parameter<double>::Parameter
            ((Parameter<double> *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
  Parameter<double>::Parameter
            ((Parameter<double> *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
  Parameter<double>::Parameter
            ((Parameter<double> *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
  Parameter<double>::Parameter
            ((Parameter<double> *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
  Parameter<double>::Parameter
            ((Parameter<double> *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
  Parameter<double>::Parameter
            ((Parameter<double> *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
  Parameter<double>::Parameter
            ((Parameter<double> *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
  Parameter<double>::Parameter
            ((Parameter<double> *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
  Parameter<double>::Parameter
            ((Parameter<double> *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
  Parameter<double>::Parameter
            ((Parameter<double> *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
  Parameter<double>::Parameter
            ((Parameter<double> *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
  Parameter<double>::Parameter
            ((Parameter<double> *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
  Parameter<double>::Parameter
            ((Parameter<double> *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
  Parameter<bool>::Parameter
            ((Parameter<bool> *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
         *)0x226b65);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea90,in_stack_ffffffffffffea88,in_stack_ffffffffffffea80);
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50),
             in_stack_ffffffffffffea48);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0xd),true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea90,in_stack_ffffffffffffea88,in_stack_ffffffffffffea80);
  local_98 = in_RDI + 0xd;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_ffffffffffffea60,&in_stack_ffffffffffffea58->first,
             (ParameterBase **)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_ffffffffffffea60,in_stack_ffffffffffffea58);
  local_a8 = (_Base_ptr)pVar2.first._M_node;
  local_a0 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x226cc2);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea90,in_stack_ffffffffffffea88,in_stack_ffffffffffffea80);
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50),
             in_stack_ffffffffffffea48);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator(&local_c9);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x17),true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea90,in_stack_ffffffffffffea88,in_stack_ffffffffffffea80);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  setDefaultValue((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50),
                  in_stack_ffffffffffffea48);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator(&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea90,in_stack_ffffffffffffea88,in_stack_ffffffffffffea80);
  local_150 = in_RDI + 0x17;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_ffffffffffffea60,&in_stack_ffffffffffffea58->first,
             (ParameterBase **)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_ffffffffffffea60,in_stack_ffffffffffffea58);
  local_160 = (_Base_ptr)pVar2.first._M_node;
  local_158 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x226eba);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator(&local_141);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea90,in_stack_ffffffffffffea88,in_stack_ffffffffffffea80);
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50),
             in_stack_ffffffffffffea48);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator(&local_181);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x21),true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea90,in_stack_ffffffffffffea88,in_stack_ffffffffffffea80);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  setDefaultValue((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50),
                  in_stack_ffffffffffffea48);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea90,in_stack_ffffffffffffea88,in_stack_ffffffffffffea80);
  local_208 = in_RDI + 0x21;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_ffffffffffffea60,&in_stack_ffffffffffffea58->first,
             (ParameterBase **)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_ffffffffffffea60,in_stack_ffffffffffffea58);
  local_218 = (_Base_ptr)pVar2.first._M_node;
  local_210 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x2270b2);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea90,in_stack_ffffffffffffea88,in_stack_ffffffffffffea80);
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50),
             in_stack_ffffffffffffea48);
  std::__cxx11::string::~string(local_238);
  std::allocator<char>::~allocator(&local_239);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x2b),true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea90,in_stack_ffffffffffffea88,in_stack_ffffffffffffea80);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  setDefaultValue((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50),
                  in_stack_ffffffffffffea48);
  std::__cxx11::string::~string(local_260);
  std::allocator<char>::~allocator(&local_261);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea90,in_stack_ffffffffffffea88,in_stack_ffffffffffffea80);
  local_2c0 = in_RDI + 0x2b;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_ffffffffffffea60,&in_stack_ffffffffffffea58->first,
             (ParameterBase **)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_ffffffffffffea60,in_stack_ffffffffffffea58);
  local_2d0 = (_Base_ptr)pVar2.first._M_node;
  local_2c8 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x2272aa);
  std::__cxx11::string::~string(local_2b0);
  std::allocator<char>::~allocator(&local_2b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea90,in_stack_ffffffffffffea88,in_stack_ffffffffffffea80);
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50),
             in_stack_ffffffffffffea48);
  std::__cxx11::string::~string(local_2f0);
  std::allocator<char>::~allocator(&local_2f1);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x35),true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea90,in_stack_ffffffffffffea88,in_stack_ffffffffffffea80);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  setDefaultValue((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50),
                  in_stack_ffffffffffffea48);
  std::__cxx11::string::~string(local_318);
  std::allocator<char>::~allocator(&local_319);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea90,in_stack_ffffffffffffea88,in_stack_ffffffffffffea80);
  local_378 = in_RDI + 0x35;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_ffffffffffffea60,&in_stack_ffffffffffffea58->first,
             (ParameterBase **)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_ffffffffffffea60,in_stack_ffffffffffffea58);
  local_388 = (_Base_ptr)pVar2.first._M_node;
  local_380 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x2274a2);
  std::__cxx11::string::~string(local_368);
  std::allocator<char>::~allocator(&local_369);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea90,in_stack_ffffffffffffea88,in_stack_ffffffffffffea80);
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50),
             in_stack_ffffffffffffea48);
  std::__cxx11::string::~string(local_3a8);
  std::allocator<char>::~allocator(&local_3a9);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x3f),true);
  local_3b8 = 1.0;
  Parameter<double>::setDefaultValue((Parameter<double> *)(in_RDI + 0x3f),&local_3b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea90,in_stack_ffffffffffffea88,in_stack_ffffffffffffea80);
  local_410 = in_RDI + 0x3f;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_ffffffffffffea60,&in_stack_ffffffffffffea58->first,
             (ParameterBase **)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_ffffffffffffea60,in_stack_ffffffffffffea58);
  local_420 = (_Base_ptr)pVar2.first._M_node;
  local_418 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x227650);
  std::__cxx11::string::~string(local_400);
  std::allocator<char>::~allocator(&local_401);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea90,in_stack_ffffffffffffea88,in_stack_ffffffffffffea80);
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50),
             in_stack_ffffffffffffea48);
  std::__cxx11::string::~string(local_440);
  std::allocator<char>::~allocator(&local_441);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x46),true);
  local_450 = 1.0;
  Parameter<double>::setDefaultValue((Parameter<double> *)(in_RDI + 0x46),&local_450);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea90,in_stack_ffffffffffffea88,in_stack_ffffffffffffea80);
  local_4a8 = in_RDI + 0x46;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_ffffffffffffea60,&in_stack_ffffffffffffea58->first,
             (ParameterBase **)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_ffffffffffffea60,in_stack_ffffffffffffea58);
  local_4b8 = (_Base_ptr)pVar2.first._M_node;
  local_4b0 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x2277fe);
  std::__cxx11::string::~string(local_498);
  std::allocator<char>::~allocator(&local_499);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea90,in_stack_ffffffffffffea88,in_stack_ffffffffffffea80);
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50),
             in_stack_ffffffffffffea48);
  std::__cxx11::string::~string(local_4d8);
  std::allocator<char>::~allocator(&local_4d9);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x4d),true);
  local_4e8 = 1.0;
  Parameter<double>::setDefaultValue((Parameter<double> *)(in_RDI + 0x4d),&local_4e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea90,in_stack_ffffffffffffea88,in_stack_ffffffffffffea80);
  local_540 = in_RDI + 0x4d;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_ffffffffffffea60,&in_stack_ffffffffffffea58->first,
             (ParameterBase **)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_ffffffffffffea60,in_stack_ffffffffffffea58);
  local_550 = (_Base_ptr)pVar2.first._M_node;
  local_548 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x2279ac);
  std::__cxx11::string::~string(local_530);
  std::allocator<char>::~allocator(&local_531);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea90,in_stack_ffffffffffffea88,in_stack_ffffffffffffea80);
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50),
             in_stack_ffffffffffffea48);
  std::__cxx11::string::~string(local_570);
  std::allocator<char>::~allocator(&local_571);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x54),true);
  local_580 = 1.0;
  Parameter<double>::setDefaultValue((Parameter<double> *)(in_RDI + 0x54),&local_580);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea90,in_stack_ffffffffffffea88,in_stack_ffffffffffffea80);
  local_5d8 = in_RDI + 0x54;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_ffffffffffffea60,&in_stack_ffffffffffffea58->first,
             (ParameterBase **)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_ffffffffffffea60,in_stack_ffffffffffffea58);
  local_5e8 = (_Base_ptr)pVar2.first._M_node;
  local_5e0 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x227b5a);
  std::__cxx11::string::~string(local_5c8);
  std::allocator<char>::~allocator(&local_5c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea90,in_stack_ffffffffffffea88,in_stack_ffffffffffffea80);
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50),
             in_stack_ffffffffffffea48);
  std::__cxx11::string::~string(local_608);
  std::allocator<char>::~allocator(&local_609);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x5b),true);
  local_618 = 1.0;
  Parameter<double>::setDefaultValue((Parameter<double> *)(in_RDI + 0x5b),&local_618);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea90,in_stack_ffffffffffffea88,in_stack_ffffffffffffea80);
  local_670 = in_RDI + 0x5b;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_ffffffffffffea60,&in_stack_ffffffffffffea58->first,
             (ParameterBase **)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_ffffffffffffea60,in_stack_ffffffffffffea58);
  local_680 = (_Base_ptr)pVar2.first._M_node;
  local_678 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x227d08);
  std::__cxx11::string::~string(local_660);
  std::allocator<char>::~allocator(&local_661);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea90,in_stack_ffffffffffffea88,in_stack_ffffffffffffea80);
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50),
             in_stack_ffffffffffffea48);
  std::__cxx11::string::~string(local_6a0);
  std::allocator<char>::~allocator(&local_6a1);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x62),true);
  local_6b0 = 1.0;
  Parameter<double>::setDefaultValue((Parameter<double> *)(in_RDI + 0x62),&local_6b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea90,in_stack_ffffffffffffea88,in_stack_ffffffffffffea80);
  local_708 = in_RDI + 0x62;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_ffffffffffffea60,&in_stack_ffffffffffffea58->first,
             (ParameterBase **)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_ffffffffffffea60,in_stack_ffffffffffffea58);
  local_718 = (_Base_ptr)pVar2.first._M_node;
  local_710 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x227eb6);
  std::__cxx11::string::~string(local_6f8);
  std::allocator<char>::~allocator(&local_6f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea90,in_stack_ffffffffffffea88,in_stack_ffffffffffffea80);
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50),
             in_stack_ffffffffffffea48);
  std::__cxx11::string::~string(local_738);
  std::allocator<char>::~allocator(&local_739);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x69),true);
  local_748 = 1.0;
  Parameter<double>::setDefaultValue((Parameter<double> *)(in_RDI + 0x69),&local_748);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea90,in_stack_ffffffffffffea88,in_stack_ffffffffffffea80);
  local_7a0 = in_RDI + 0x69;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_ffffffffffffea60,&in_stack_ffffffffffffea58->first,
             (ParameterBase **)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_ffffffffffffea60,in_stack_ffffffffffffea58);
  local_7b0 = (_Base_ptr)pVar2.first._M_node;
  local_7a8 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x228064);
  std::__cxx11::string::~string(local_790);
  std::allocator<char>::~allocator(&local_791);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea90,in_stack_ffffffffffffea88,in_stack_ffffffffffffea80);
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50),
             in_stack_ffffffffffffea48);
  std::__cxx11::string::~string(local_7d0);
  std::allocator<char>::~allocator(&local_7d1);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x70),true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea90,in_stack_ffffffffffffea88,in_stack_ffffffffffffea80);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  setDefaultValue((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50),
                  in_stack_ffffffffffffea48);
  std::__cxx11::string::~string(local_7f8);
  std::allocator<char>::~allocator(&local_7f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea90,in_stack_ffffffffffffea88,in_stack_ffffffffffffea80);
  local_858 = in_RDI + 0x70;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_ffffffffffffea60,&in_stack_ffffffffffffea58->first,
             (ParameterBase **)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_ffffffffffffea60,in_stack_ffffffffffffea58);
  local_868 = (_Base_ptr)pVar2.first._M_node;
  local_860 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x22825c);
  std::__cxx11::string::~string(local_848);
  std::allocator<char>::~allocator(&local_849);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea90,in_stack_ffffffffffffea88,in_stack_ffffffffffffea80);
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50),
             in_stack_ffffffffffffea48);
  std::__cxx11::string::~string(local_888);
  std::allocator<char>::~allocator(&local_889);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x7a),true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea90,in_stack_ffffffffffffea88,in_stack_ffffffffffffea80);
  local_8e8 = in_RDI + 0x7a;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_ffffffffffffea60,&in_stack_ffffffffffffea58->first,
             (ParameterBase **)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_ffffffffffffea60,in_stack_ffffffffffffea58);
  local_8f8 = (_Base_ptr)pVar2.first._M_node;
  local_8f0 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x2283da);
  std::__cxx11::string::~string(local_8d8);
  std::allocator<char>::~allocator(&local_8d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea90,in_stack_ffffffffffffea88,in_stack_ffffffffffffea80);
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50),
             in_stack_ffffffffffffea48);
  std::__cxx11::string::~string(local_918);
  std::allocator<char>::~allocator(&local_919);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x81),true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea90,in_stack_ffffffffffffea88,in_stack_ffffffffffffea80);
  local_978 = in_RDI + 0x81;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_ffffffffffffea60,&in_stack_ffffffffffffea58->first,
             (ParameterBase **)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_ffffffffffffea60,in_stack_ffffffffffffea58);
  local_988 = (_Base_ptr)pVar2.first._M_node;
  local_980 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x228558);
  std::__cxx11::string::~string(local_968);
  std::allocator<char>::~allocator(&local_969);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea90,in_stack_ffffffffffffea88,in_stack_ffffffffffffea80);
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50),
             in_stack_ffffffffffffea48);
  std::__cxx11::string::~string(local_9a8);
  std::allocator<char>::~allocator(&local_9a9);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x88),true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea90,in_stack_ffffffffffffea88,in_stack_ffffffffffffea80);
  local_a08 = in_RDI + 0x88;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_ffffffffffffea60,&in_stack_ffffffffffffea58->first,
             (ParameterBase **)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_ffffffffffffea60,in_stack_ffffffffffffea58);
  local_a18 = (_Base_ptr)pVar2.first._M_node;
  local_a10 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x2286d6);
  std::__cxx11::string::~string(local_9f8);
  std::allocator<char>::~allocator(&local_9f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea90,in_stack_ffffffffffffea88,in_stack_ffffffffffffea80);
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50),
             in_stack_ffffffffffffea48);
  std::__cxx11::string::~string(local_a38);
  std::allocator<char>::~allocator(&local_a39);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x9d),true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea90,in_stack_ffffffffffffea88,in_stack_ffffffffffffea80);
  local_a98 = in_RDI + 0x9d;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_ffffffffffffea60,&in_stack_ffffffffffffea58->first,
             (ParameterBase **)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_ffffffffffffea60,in_stack_ffffffffffffea58);
  local_aa8 = (_Base_ptr)pVar2.first._M_node;
  local_aa0 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x228854);
  std::__cxx11::string::~string(local_a88);
  std::allocator<char>::~allocator(&local_a89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea90,in_stack_ffffffffffffea88,in_stack_ffffffffffffea80);
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50),
             in_stack_ffffffffffffea48);
  std::__cxx11::string::~string(local_ac8);
  std::allocator<char>::~allocator(&local_ac9);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0xa4),true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea90,in_stack_ffffffffffffea88,in_stack_ffffffffffffea80);
  local_b28 = in_RDI + 0xa4;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_ffffffffffffea60,&in_stack_ffffffffffffea58->first,
             (ParameterBase **)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_ffffffffffffea60,in_stack_ffffffffffffea58);
  local_b38 = (_Base_ptr)pVar2.first._M_node;
  local_b30 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x2289d2);
  std::__cxx11::string::~string(local_b18);
  std::allocator<char>::~allocator(&local_b19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea90,in_stack_ffffffffffffea88,in_stack_ffffffffffffea80);
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50),
             in_stack_ffffffffffffea48);
  std::__cxx11::string::~string(local_b58);
  std::allocator<char>::~allocator(&local_b59);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0xab),true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea90,in_stack_ffffffffffffea88,in_stack_ffffffffffffea80);
  local_bb8 = in_RDI + 0xab;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_ffffffffffffea60,&in_stack_ffffffffffffea58->first,
             (ParameterBase **)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_ffffffffffffea60,in_stack_ffffffffffffea58);
  local_bc8 = (_Base_ptr)pVar2.first._M_node;
  local_bc0 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x228b50);
  std::__cxx11::string::~string(local_ba8);
  std::allocator<char>::~allocator(&local_ba9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea90,in_stack_ffffffffffffea88,in_stack_ffffffffffffea80);
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50),
             in_stack_ffffffffffffea48);
  std::__cxx11::string::~string(local_be8);
  std::allocator<char>::~allocator(&local_be9);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x8f),true);
  local_bf8 = 1.0;
  Parameter<double>::setDefaultValue((Parameter<double> *)(in_RDI + 0x8f),&local_bf8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea90,in_stack_ffffffffffffea88,in_stack_ffffffffffffea80);
  local_c50 = in_RDI + 0x8f;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_ffffffffffffea60,&in_stack_ffffffffffffea58->first,
             (ParameterBase **)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_ffffffffffffea60,in_stack_ffffffffffffea58);
  local_c60 = (_Base_ptr)pVar2.first._M_node;
  local_c58 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x228cfe);
  std::__cxx11::string::~string(local_c40);
  std::allocator<char>::~allocator(&local_c41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea90,in_stack_ffffffffffffea88,in_stack_ffffffffffffea80);
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50),
             in_stack_ffffffffffffea48);
  std::__cxx11::string::~string(local_c80);
  std::allocator<char>::~allocator(&local_c81);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x96),true);
  local_c90 = 1.0;
  Parameter<double>::setDefaultValue((Parameter<double> *)(in_RDI + 0x96),&local_c90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea90,in_stack_ffffffffffffea88,in_stack_ffffffffffffea80);
  local_ce8 = in_RDI + 0x96;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_ffffffffffffea60,&in_stack_ffffffffffffea58->first,
             (ParameterBase **)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_ffffffffffffea60,in_stack_ffffffffffffea58);
  local_cf8 = (_Base_ptr)pVar2.first._M_node;
  local_cf0 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x228eac);
  std::__cxx11::string::~string(local_cd8);
  std::allocator<char>::~allocator(&local_cd9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea90,in_stack_ffffffffffffea88,in_stack_ffffffffffffea80);
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50),
             in_stack_ffffffffffffea48);
  std::__cxx11::string::~string(local_d18);
  std::allocator<char>::~allocator(&local_d19);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0xb2),true);
  local_d28 = 2.0;
  Parameter<double>::setDefaultValue((Parameter<double> *)(in_RDI + 0xb2),&local_d28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea90,in_stack_ffffffffffffea88,in_stack_ffffffffffffea80);
  local_d80 = in_RDI + 0xb2;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_ffffffffffffea60,&in_stack_ffffffffffffea58->first,
             (ParameterBase **)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_ffffffffffffea60,in_stack_ffffffffffffea58);
  local_d90 = (_Base_ptr)pVar2.first._M_node;
  local_d88 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x22905a);
  std::__cxx11::string::~string(local_d70);
  std::allocator<char>::~allocator(&local_d71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea90,in_stack_ffffffffffffea88,in_stack_ffffffffffffea80);
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50),
             in_stack_ffffffffffffea48);
  std::__cxx11::string::~string(local_db0);
  std::allocator<char>::~allocator(&local_db1);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0xb9),true);
  local_dc0 = 1.0;
  Parameter<double>::setDefaultValue((Parameter<double> *)(in_RDI + 0xb9),&local_dc0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea90,in_stack_ffffffffffffea88,in_stack_ffffffffffffea80);
  local_e18 = in_RDI + 0xb9;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_ffffffffffffea60,&in_stack_ffffffffffffea58->first,
             (ParameterBase **)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_ffffffffffffea60,in_stack_ffffffffffffea58);
  local_e28 = (_Base_ptr)pVar2.first._M_node;
  local_e20 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x229208);
  std::__cxx11::string::~string(local_e08);
  std::allocator<char>::~allocator(&local_e09);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea90,in_stack_ffffffffffffea88,in_stack_ffffffffffffea80);
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50),
             in_stack_ffffffffffffea48);
  std::__cxx11::string::~string(local_e48);
  std::allocator<char>::~allocator(&local_e49);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0xc0),true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea90,in_stack_ffffffffffffea88,in_stack_ffffffffffffea80);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  setDefaultValue((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50),
                  in_stack_ffffffffffffea48);
  std::__cxx11::string::~string(local_e70);
  std::allocator<char>::~allocator(&local_e71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea90,in_stack_ffffffffffffea88,in_stack_ffffffffffffea80);
  local_ed0 = in_RDI + 0xc0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_ffffffffffffea60,&in_stack_ffffffffffffea58->first,
             (ParameterBase **)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_ffffffffffffea60,in_stack_ffffffffffffea58);
  local_ee0 = (_Base_ptr)pVar2.first._M_node;
  local_ed8 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x2293e2);
  std::__cxx11::string::~string(local_ec0);
  std::allocator<char>::~allocator(&local_ec1);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0xca);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,in_stack_ffffffffffffea88,in_stack_ffffffffffffea80);
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50),
             in_stack_ffffffffffffea48);
  std::__cxx11::string::~string(local_f00);
  std::allocator<char>::~allocator(&local_f01);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0xca),true);
  local_f02 = false;
  Parameter<bool>::setDefaultValue((Parameter<bool> *)(in_RDI + 0xca),&local_f02);
  __a = (allocator<char> *)(in_RDI + 0xd0);
  __s = &local_f51;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  local_f60 = in_RDI + 0xca;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_ffffffffffffea60,&in_stack_ffffffffffffea58->first,
             (ParameterBase **)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_ffffffffffffea60,in_stack_ffffffffffffea58);
  local_f70 = (_Base_ptr)pVar2.first._M_node;
  uVar1 = pVar2.second;
  local_f68 = uVar1;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x229562);
  std::__cxx11::string::~string(local_f50);
  std::allocator<char>::~allocator(&local_f51);
  __x = (value_type *)local_f91;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)CONCAT17(uVar1,in_stack_ffffffffffffea70),__x);
  std::__cxx11::string::~string((string *)(local_f91 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_f91);
  return;
}

Assistant:

ForceFieldOptions::ForceFieldOptions() {
    DefineOptionalParameter(Name, "Name");
    DefineOptionalParameterWithDefaultValue(vdWtype, "vdWtype",
                                            "Lennard-Jones");
    DefineOptionalParameterWithDefaultValue(DistanceMixingRule,
                                            "DistanceMixingRule", "arithmetic");
    DefineOptionalParameterWithDefaultValue(DistanceType, "DistanceType",
                                            "sigma");
    DefineOptionalParameterWithDefaultValue(EnergyMixingRule,
                                            "EnergyMixingRule", "geometric");
    DefineOptionalParameterWithDefaultValue(EnergyUnitScaling,
                                            "EnergyUnitScaling", 1.0);
    DefineOptionalParameterWithDefaultValue(MetallicEnergyUnitScaling,
                                            "MetallicEnergyUnitScaling", 1.0);
    DefineOptionalParameterWithDefaultValue(
        FluctuatingChargeEnergyUnitScaling,
        "FluctuatingChargeEnergyUnitScaling", 1.0);
    DefineOptionalParameterWithDefaultValue(DistanceUnitScaling,
                                            "DistanceUnitScaling", 1.0);
    DefineOptionalParameterWithDefaultValue(AngleUnitScaling,
                                            "AngleUnitScaling", 1.0);
    DefineOptionalParameterWithDefaultValue(ChargeUnitScaling,
                                            "ChargeUnitScaling", 1.0);
    DefineOptionalParameterWithDefaultValue(OxidationStateScaling,
                                            "OxidationStateScaling", 1.0);
    DefineOptionalParameterWithDefaultValue(
        TorsionAngleConvention, "TorsionAngleConvention", "180_is_trans");
    DefineOptionalParameter(vdw12scale, "vdW-12-scale");
    DefineOptionalParameter(vdw13scale, "vdW-13-scale");
    DefineOptionalParameter(vdw14scale, "vdW-14-scale");
    DefineOptionalParameter(electrostatic12scale, "electrostatic-12-scale");
    DefineOptionalParameter(electrostatic13scale, "electrostatic-13-scale");
    DefineOptionalParameter(electrostatic14scale, "electrostatic-14-scale");
    DefineOptionalParameterWithDefaultValue(BondForceConstantScaling,
                                            "BondForceConstantScaling", 1.0);
    DefineOptionalParameterWithDefaultValue(BendForceConstantScaling,
                                            "BendForceConstantScaling", 1.0);

    // DefineOptionalParameterWithDefaultValue(vdw12scale, "vdW-12-scale", 0.0);
    // DefineOptionalParameterWithDefaultValue(vdw13scale, "vdW-13-scale", 0.0);
    // DefineOptionalParameterWithDefaultValue(vdw14scale, "vdW-14-scale", 0.0);
    // DefineOptionalParameterWithDefaultValue(electrostatic12scale,
    // "electrostatic-12-scale", 0.0);
    // DefineOptionalParameterWithDefaultValue(electrostatic13scale,
    // "electrostatic-13-scale", 0.0);
    // DefineOptionalParameterWithDefaultValue(electrostatic14scale,
    // "electrostatic-14-scale", 0.0);
    DefineOptionalParameterWithDefaultValue(GayBerneMu, "GayBerneMu", 2.0);
    DefineOptionalParameterWithDefaultValue(GayBerneNu, "GayBerneNu", 1.0);
    DefineOptionalParameterWithDefaultValue(EAMMixingMethod, "EAMMixingMethod",
                                            "Johnson");
    DefineOptionalParameterWithDefaultValue(
        DelayedParameterCalculation, "delayedParameterCalculation", false);

    deprecatedKeywords_.insert("cutoffPolicy");
  }